

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<56,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  undefined7 in_register_00000081;
  int iVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  Blob<56> local_54;
  undefined4 local_4c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  local_4c = (undefined4)CONCAT71(in_register_00000081,testDist);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x38,pcVar2,(ulong)(uint)setbits);
  local_54.bytes[4] = '\0';
  local_54.bytes[5] = '\0';
  local_54.bytes[6] = '\0';
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_54.bytes[0] = '\0';
  local_54.bytes[1] = '\0';
  local_54.bytes[2] = '\0';
  local_54.bytes[3] = '\0';
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iVar3 != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_48,1);
    (*hash.m_hash)(&local_54,7,0,
                   local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<56>,unsigned_long>(hash.m_hash,0,setbits,inclusive,&local_54,&local_48);
  printf("%d keys\n",
         (ulong)((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 3);
  bVar1 = TestHashList<unsigned_long>(&local_48,drawDiagram,testColl,local_4c._0_1_,true,true);
  putchar(10);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}